

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O3

void __thiscall CMU462::PathTracer::start_raytracing(PathTracer *this)

{
  size_t sVar1;
  pointer pLVar2;
  pointer __s;
  pointer __s_00;
  size_t sVar3;
  thread *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  WorkItem local_48;
  PathTracer *local_38;
  
  if (this->state == READY) {
    pLVar2 = (this->rayLog).
             super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>.
        _M_impl.super__Vector_impl_data._M_finish != pLVar2) {
      (this->rayLog).super__Vector_base<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>.
      _M_impl.super__Vector_impl_data._M_finish = pLVar2;
    }
    WorkQueue<CMU462::WorkItem>::clear(&this->workQueue);
    this->state = RENDERING;
    this->continueRaytracing = true;
    LOCK();
    (this->workerDoneCount).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    __s = (this->sampleBuffer).data.
          super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((this->sampleBuffer).data.
        super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
        super__Vector_impl_data._M_finish != __s) {
      memset(__s,0,(this->sampleBuffer).w * (this->sampleBuffer).h * 0xc);
    }
    __s_00 = (this->frameBuffer).data.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->frameBuffer).data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != __s_00) {
      memset(__s_00,0,(this->frameBuffer).w * (this->frameBuffer).h * 4);
    }
    uVar6 = (this->sampleBuffer).h;
    sVar3 = (this->sampleBuffer).w / this->imageTileSize + 1;
    this->num_tiles_w = sVar3;
    sVar1 = uVar6 / this->imageTileSize + 1;
    this->num_tiles_h = sVar1;
    std::vector<int,_std::allocator<int>_>::resize(&this->tile_samples,sVar1 * sVar3);
    memset((this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,0,this->num_tiles_w * this->num_tiles_h * 4);
    uVar6 = (this->sampleBuffer).h;
    if (uVar6 != 0) {
      uVar4 = (this->sampleBuffer).w;
      sVar3 = this->imageTileSize;
      uVar5 = 0;
      do {
        if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          uVar6 = 0;
          do {
            local_48._0_8_ = CONCAT44((int)uVar5,(int)uVar6);
            local_48.tile_h = (int)sVar3;
            local_48.tile_w = (int)sVar3;
            WorkQueue<CMU462::WorkItem>::put_work(&this->workQueue,&local_48);
            uVar4 = (this->sampleBuffer).w;
            sVar3 = this->imageTileSize;
            uVar6 = uVar6 + sVar3;
          } while (uVar6 < uVar4);
          uVar6 = (this->sampleBuffer).h;
        }
        uVar5 = uVar5 + sVar3;
      } while (uVar5 < uVar6);
    }
    fwrite("[PathTracer] Rendering... ",0x1a,1,_stdout);
    fflush(_stdout);
    if (this->numWorkerThreads != 0) {
      uVar6 = 0;
      do {
        this_00 = (thread *)operator_new(8);
        local_48._0_8_ = worker_thread;
        local_48.tile_w = 0;
        local_48.tile_h = 0;
        local_38 = this;
        std::thread::thread<void(CMU462::PathTracer::*)(),CMU462::PathTracer*,void>
                  (this_00,(offset_in_PathTracer_to_subr *)&local_48,&local_38);
        (this->workerThreads).super__Vector_base<std::thread_*,_std::allocator<std::thread_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar6] = this_00;
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->numWorkerThreads);
    }
  }
  return;
}

Assistant:

void PathTracer::start_raytracing() {
    if (state != READY) return;

    rayLog.clear();
    workQueue.clear();

    state = RENDERING;
    continueRaytracing = true;
    workerDoneCount = 0;

    sampleBuffer.clear();
    frameBuffer.clear();
    num_tiles_w = sampleBuffer.w / imageTileSize + 1;
    num_tiles_h = sampleBuffer.h / imageTileSize + 1;
    tile_samples.resize(num_tiles_w * num_tiles_h);
    memset(&tile_samples[0], 0, num_tiles_w * num_tiles_h * sizeof(int));

    // populate the tile work queue
    for (size_t y = 0; y < sampleBuffer.h; y += imageTileSize) {
      for (size_t x = 0; x < sampleBuffer.w; x += imageTileSize) {
        workQueue.put_work(WorkItem(x, y, imageTileSize, imageTileSize));
      }
    }

    // launch threads
    fprintf(stdout, "[PathTracer] Rendering... "); fflush(stdout);
    for (int i=0; i<numWorkerThreads; i++) {
      workerThreads[i] = new std::thread(&PathTracer::worker_thread, this);
    }
  }